

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gv_visitor.cpp
# Opt level: O2

void __thiscall gv_visitor::visit(gv_visitor *this,MoreThanOneMethodArgs *ptr)

{
  pointer ppMVar1;
  Method_arg *second;
  pointer ppMVar2;
  string local_58;
  allocator<char> local_31;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"mnogo args",&local_31);
  box(this,ptr,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  ppMVar1 = (ptr->super_Method_args).args.
            super__Vector_base<Method_arg_*,_std::allocator<Method_arg_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppMVar2 = (ptr->super_Method_args).args.
                 super__Vector_base<Method_arg_*,_std::allocator<Method_arg_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppMVar2 != ppMVar1; ppMVar2 = ppMVar2 + 1) {
    second = *ppMVar2;
    arrow(this,ptr,second);
    (**(second->super_Base)._vptr_Base)(second,this);
  }
  return;
}

Assistant:

void gv_visitor::visit(MoreThanOneMethodArgs* ptr) {
    box(ptr, "mnogo args");
    for(auto i : ptr->args) {
        arrow(ptr, i);
        i->accept(this);
    }
}